

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::GLES2SharedRenderingPerfTests::init
          (GLES2SharedRenderingPerfTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  EglTestContext *pEVar3;
  int extraout_EAX;
  TestCaseGroup *pTVar4;
  SharedRenderingPerfCase *pSVar5;
  char *pcVar6;
  string local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  undefined1 local_ca8 [8];
  TestConfig bigConfig_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  undefined1 local_c30 [8];
  TestConfig smallConfig_9;
  TestConfig config_9;
  int contextCount_9;
  int contextCountNdx_9;
  int threadCount_9;
  int threadCountNdx_9;
  TestCaseGroup *sharedTextureGroup_3;
  string local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  undefined1 local_b68 [8];
  TestConfig bigConfig_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  undefined1 local_af0 [8];
  TestConfig smallConfig_8;
  TestConfig config_8;
  int contextCount_8;
  int contextCountNdx_8;
  int threadCount_8;
  int threadCountNdx_8;
  TestCaseGroup *sharedTextureGroup_2;
  string local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  undefined1 local_a28 [8];
  TestConfig bigConfig_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  undefined1 local_9b0 [8];
  TestConfig smallConfig_7;
  TestConfig config_7;
  int contextCount_7;
  int contextCountNdx_7;
  int threadCount_7;
  int threadCountNdx_7;
  TestCaseGroup *sharedTextureGroup_1;
  string local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  undefined1 local_8e8 [8];
  TestConfig bigConfig_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  undefined1 local_870 [8];
  TestConfig smallConfig_6;
  TestConfig config_6;
  int contextCount_6;
  int contextCountNdx_6;
  int threadCount_6;
  int threadCountNdx_6;
  TestCaseGroup *sharedallGroup;
  string local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  undefined1 local_7a8 [8];
  TestConfig bigConfig_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  undefined1 local_730 [8];
  TestConfig smallConfig_5;
  TestConfig config_5;
  int contextCount_5;
  int contextCountNdx_5;
  int threadCount_5;
  int threadCountNdx_5;
  TestCaseGroup *sharedProgramGroup;
  string local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  undefined1 local_668 [8];
  TestConfig bigConfig_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  undefined1 local_5f0 [8];
  TestConfig smallConfig_4;
  TestConfig config_4;
  int contextCount_4;
  int contextCountNdx_4;
  int threadCount_4;
  int threadCountNdx_4;
  TestCaseGroup *sharedTextureGroup;
  string local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  undefined1 local_528 [8];
  TestConfig bigConfig_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [8];
  TestConfig smallConfig_3;
  TestConfig config_3;
  int contextCount_3;
  int contextCountNdx_3;
  int threadCount_3;
  int threadCountNdx_3;
  TestCaseGroup *sharedIndexBufferGroup;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [8];
  TestConfig bigConfig_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  TestConfig smallConfig_2;
  TestConfig config_2;
  int contextCount_2;
  int contextCountNdx_2;
  int threadCount_2;
  int threadCountNdx_2;
  TestCaseGroup *sharedCoordBufferGroup;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  TestConfig bigConfig_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  TestConfig smallConfig_1;
  TestConfig config_1;
  int contextCount_1;
  int contextCountNdx_1;
  int threadCount_1;
  int threadCountNdx_1;
  TestCaseGroup *sharedNoneGroup_1;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  TestConfig bigConfig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_ec [8];
  TestConfig smallConfig;
  TestConfig config;
  int contextCount;
  int contextCountNdx;
  int threadCount;
  int threadCountNdx;
  TestCaseGroup *sharedNoneGroup;
  int perThreadContextCounts [3];
  int threadCounts [3];
  TestConfig basicConfig;
  GLES2SharedRenderingPerfTests *this_local;
  
  threadCounts[1] = 1;
  threadCounts[2] = 1;
  stack0xffffffffffffffb0 = 0x200000001;
  threadCounts[0] = 4;
  perThreadContextCounts[0] = 4;
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"no_shared_context",
             "Tests without sharing contexts.");
  for (contextCountNdx = 0; contextCountNdx < 3; contextCountNdx = contextCountNdx + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx + 2];
    for (config.surfaceHeight = 0; config.surfaceHeight < 3;
        config.surfaceHeight = config.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig.surfaceWidth,threadCounts + 1,0x34);
        smallConfig.surfaceWidth = uVar1;
        smallConfig.surfaceHeight = iVar2;
        memcpy(local_ec,&smallConfig.surfaceWidth,0x34);
        smallConfig.frameCount = 1;
        smallConfig.perThreadContextCount = 1000;
        smallConfig.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_ec,pcVar6,"");
        bigConfig.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&bigConfig.surfaceHeight);
        memcpy(local_168,&smallConfig.surfaceWidth,0x34);
        bigConfig.frameCount = 1000;
        bigConfig.perThreadContextCount = 1;
        bigConfig.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_1a8,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_188,&local_1a8,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_168,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"no_shared_resource",
             "Tests without shared resources.");
  for (contextCountNdx_1 = 0; contextCountNdx_1 < 3; contextCountNdx_1 = contextCountNdx_1 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_1 + 2];
    for (config_1.surfaceHeight = 0; config_1.surfaceHeight < 3;
        config_1.surfaceHeight = config_1.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_1.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_1.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_1.surfaceWidth = uVar1;
        smallConfig_1.surfaceHeight = iVar2;
        memcpy(local_230,&smallConfig_1.surfaceWidth,0x34);
        smallConfig_1.frameCount = 1;
        smallConfig_1.perThreadContextCount = 1000;
        smallConfig_1.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_1.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_1.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_1.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_250,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_1.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_230,pcVar6,"");
        bigConfig_1.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&bigConfig_1.surfaceHeight);
        memcpy(local_2a8,&smallConfig_1.surfaceWidth,0x34);
        bigConfig_1.frameCount = 1000;
        bigConfig_1.perThreadContextCount = 1;
        bigConfig_1.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_1.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_2e8,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_2c8,&local_2e8,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_2a8,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"shared_coord_buffer",
             "Shared coordinate bufffer");
  for (contextCountNdx_2 = 0; contextCountNdx_2 < 3; contextCountNdx_2 = contextCountNdx_2 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_2 + 2];
    for (config_2.surfaceHeight = 0; config_2.surfaceHeight < 3;
        config_2.surfaceHeight = config_2.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_2.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_2.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_2.surfaceWidth = uVar1;
        smallConfig_2.surfaceHeight = iVar2;
        memcpy(local_370,&smallConfig_2.surfaceWidth,0x34);
        smallConfig_2.frameCount = 1;
        smallConfig_2.perThreadContextCount = 1000;
        smallConfig_2.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_2.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_2.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_2.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_390,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_2.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_370,pcVar6,"");
        bigConfig_2.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&bigConfig_2.surfaceHeight);
        memcpy(local_3e8,&smallConfig_2.surfaceWidth,0x34);
        bigConfig_2.frameCount = 1000;
        bigConfig_2.perThreadContextCount = 1;
        bigConfig_2.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_2.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_428,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_408,&local_428,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_3e8,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_428);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"shared_index_buffer",
             "Shared index bufffer");
  for (contextCountNdx_3 = 0; contextCountNdx_3 < 3; contextCountNdx_3 = contextCountNdx_3 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_3 + 2];
    for (config_3.surfaceHeight = 0; config_3.surfaceHeight < 3;
        config_3.surfaceHeight = config_3.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_3.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_3.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_3.surfaceWidth = uVar1;
        smallConfig_3.surfaceHeight = iVar2;
        memcpy(local_4b0,&smallConfig_3.surfaceWidth,0x34);
        smallConfig_3.frameCount = 1;
        smallConfig_3.perThreadContextCount = 1000;
        smallConfig_3.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_3.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_3.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_3.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_4d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_3.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_4b0,pcVar6,"");
        bigConfig_3.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&bigConfig_3.surfaceHeight);
        memcpy(local_528,&smallConfig_3.surfaceWidth,0x34);
        bigConfig_3.frameCount = 1000;
        bigConfig_3.perThreadContextCount = 1;
        bigConfig_3.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_3.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_568,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_548,&local_568,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_528,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"shared_texture",
             "Shared texture tests.");
  for (contextCountNdx_4 = 0; contextCountNdx_4 < 3; contextCountNdx_4 = contextCountNdx_4 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_4 + 2];
    for (config_4.surfaceHeight = 0; config_4.surfaceHeight < 3;
        config_4.surfaceHeight = config_4.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_4.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_4.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_4.surfaceWidth = uVar1;
        smallConfig_4.surfaceHeight = iVar2;
        memcpy(local_5f0,&smallConfig_4.surfaceWidth,0x34);
        smallConfig_4.frameCount = 1;
        smallConfig_4.perThreadContextCount = 1000;
        smallConfig_4.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_4.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_4.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_4.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_610,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_4.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_5f0,pcVar6,"");
        bigConfig_4.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::~string((string *)&bigConfig_4.surfaceHeight);
        memcpy(local_668,&smallConfig_4.surfaceWidth,0x34);
        bigConfig_4.frameCount = 1000;
        bigConfig_4.perThreadContextCount = 1;
        bigConfig_4.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_4.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_6a8,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_688,&local_6a8,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_668,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_688);
        std::__cxx11::string::~string((string *)&local_6a8);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"shared_program",
             "Shared program tests.");
  for (contextCountNdx_5 = 0; contextCountNdx_5 < 3; contextCountNdx_5 = contextCountNdx_5 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_5 + 2];
    for (config_5.surfaceHeight = 0; config_5.surfaceHeight < 3;
        config_5.surfaceHeight = config_5.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_5.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_5.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_5.surfaceWidth = uVar1;
        smallConfig_5.surfaceHeight = iVar2;
        memcpy(local_730,&smallConfig_5.surfaceWidth,0x34);
        smallConfig_5.frameCount = 1;
        smallConfig_5.perThreadContextCount = 1000;
        smallConfig_5.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_5.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_5.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_5.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_750,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_5.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_730,pcVar6,"");
        bigConfig_5.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_750);
        std::__cxx11::string::~string((string *)&bigConfig_5.surfaceHeight);
        memcpy(local_7a8,&smallConfig_5.surfaceWidth,0x34);
        bigConfig_5.frameCount = 1000;
        bigConfig_5.perThreadContextCount = 1;
        bigConfig_5.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_5.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_7e8,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_7c8,&local_7e8,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_7a8,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::__cxx11::string::~string((string *)&local_7e8);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"shared_all",
             "Share all possible resources.");
  for (contextCountNdx_6 = 0; contextCountNdx_6 < 3; contextCountNdx_6 = contextCountNdx_6 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_6 + 2];
    for (config_6.surfaceHeight = 0; config_6.surfaceHeight < 3;
        config_6.surfaceHeight = config_6.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_6.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_6.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_6.surfaceWidth = uVar1;
        smallConfig_6.surfaceHeight = iVar2;
        memcpy(local_870,&smallConfig_6.surfaceWidth,0x34);
        smallConfig_6.frameCount = 1;
        smallConfig_6.perThreadContextCount = 1000;
        smallConfig_6.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_6.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_6.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_6.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_890,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_6.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_870,pcVar6,"");
        bigConfig_6.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_890);
        std::__cxx11::string::~string((string *)&bigConfig_6.surfaceHeight);
        memcpy(local_8e8,&smallConfig_6.surfaceWidth,0x34);
        bigConfig_6.frameCount = 1000;
        bigConfig_6.perThreadContextCount = 1;
        bigConfig_6.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_6.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_928,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_908,&local_928,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_8e8,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_908);
        std::__cxx11::string::~string((string *)&local_928);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"egl_image","EGL image tests.");
  for (contextCountNdx_7 = 0; contextCountNdx_7 < 3; contextCountNdx_7 = contextCountNdx_7 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_7 + 2];
    for (config_7.surfaceHeight = 0; config_7.surfaceHeight < 3;
        config_7.surfaceHeight = config_7.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_7.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_7.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_7.surfaceWidth = uVar1;
        smallConfig_7.surfaceHeight = iVar2;
        memcpy(local_9b0,&smallConfig_7.surfaceWidth,0x34);
        smallConfig_7.frameCount = 1;
        smallConfig_7.perThreadContextCount = 1000;
        smallConfig_7.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_7.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_7.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_7.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_9d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_7.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_9b0,pcVar6,"");
        bigConfig_7.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_9d0);
        std::__cxx11::string::~string((string *)&bigConfig_7.surfaceHeight);
        memcpy(local_a28,&smallConfig_7.surfaceWidth,0x34);
        bigConfig_7.frameCount = 1000;
        bigConfig_7.perThreadContextCount = 1;
        bigConfig_7.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_7.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_a68,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_a48,&local_a68,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_a28,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_a48);
        std::__cxx11::string::~string((string *)&local_a68);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"shared_egl_image",
             "Shared EGLImage tests.");
  for (contextCountNdx_8 = 0; contextCountNdx_8 < 3; contextCountNdx_8 = contextCountNdx_8 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_8 + 2];
    for (config_8.surfaceHeight = 0; config_8.surfaceHeight < 3;
        config_8.surfaceHeight = config_8.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_8.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_8.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_8.surfaceWidth = uVar1;
        smallConfig_8.surfaceHeight = iVar2;
        memcpy(local_af0,&smallConfig_8.surfaceWidth,0x34);
        smallConfig_8.frameCount = 1;
        smallConfig_8.perThreadContextCount = 1000;
        smallConfig_8.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_8.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_8.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_8.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_b10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_8.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_af0,pcVar6,"");
        bigConfig_8.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_b10);
        std::__cxx11::string::~string((string *)&bigConfig_8.surfaceHeight);
        memcpy(local_b68,&smallConfig_8.surfaceWidth,0x34);
        bigConfig_8.frameCount = 1000;
        bigConfig_8.perThreadContextCount = 1;
        bigConfig_8.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_8.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_ba8,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_b88,&local_ba8,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_b68,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_b88);
        std::__cxx11::string::~string((string *)&local_ba8);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"shared_egl_image_texture",
             "Shared EGLImage texture tests.");
  for (contextCountNdx_9 = 0; contextCountNdx_9 < 3; contextCountNdx_9 = contextCountNdx_9 + 1) {
    uVar1 = perThreadContextCounts[(long)contextCountNdx_9 + 2];
    for (config_9.surfaceHeight = 0; config_9.surfaceHeight < 3;
        config_9.surfaceHeight = config_9.surfaceHeight + 1) {
      iVar2 = perThreadContextCounts[(long)config_9.surfaceHeight + -2];
      if ((uVar1 * iVar2 == 4) || (uVar1 * iVar2 == 1)) {
        memcpy(&smallConfig_9.surfaceWidth,threadCounts + 1,0x34);
        smallConfig_9.surfaceWidth = uVar1;
        smallConfig_9.surfaceHeight = iVar2;
        memcpy(local_c30,&smallConfig_9.surfaceWidth,0x34);
        smallConfig_9.frameCount = 1;
        smallConfig_9.perThreadContextCount = 1000;
        smallConfig_9.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          smallConfig_9.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        bigConfig_9.surfaceWidth._3_1_ = 1;
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  ((string *)&bigConfig_9.surfaceHeight,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,
                   (int)pSVar5);
        std::operator+(&local_c50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bigConfig_9.surfaceHeight,"_small_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_c30,pcVar6,"");
        bigConfig_9.surfaceWidth._3_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_c50);
        std::__cxx11::string::~string((string *)&bigConfig_9.surfaceHeight);
        memcpy(local_ca8,&smallConfig_9.surfaceWidth,0x34);
        bigConfig_9.frameCount = 1000;
        bigConfig_9.perThreadContextCount = 1;
        bigConfig_9.threadCount = 10;
        if (uVar1 * iVar2 == 1) {
          bigConfig_9.threadCount = 0x28;
        }
        pSVar5 = (SharedRenderingPerfCase *)operator_new(0xe8);
        pEVar3 = (this->super_TestCaseGroup).m_eglTestCtx;
        (anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_ce8,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,(int)pSVar5);
        std::operator+(&local_cc8,&local_ce8,"_big_call");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        anon_unknown_0::SharedRenderingPerfCase::SharedRenderingPerfCase
                  (pSVar5,pEVar3,(TestConfig *)local_ca8,pcVar6,"");
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar5);
        std::__cxx11::string::~string((string *)&local_cc8);
        std::__cxx11::string::~string((string *)&local_ce8);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  return extraout_EAX;
}

Assistant:

void GLES2SharedRenderingPerfTests::init (void)
{
	TestConfig basicConfig;

	basicConfig.threadCount					= 1;
	basicConfig.perThreadContextCount		= 1;

	basicConfig.sharedContexts				= true;
	basicConfig.frameCount					= 10;
	basicConfig.drawCallCount				= 10;
	basicConfig.triangleCount				= 100;

	basicConfig.useCoordBuffer				= true;
	basicConfig.sharedCoordBuffer			= false;

	basicConfig.useIndices					= true;
	basicConfig.useIndexBuffer				= true;
	basicConfig.sharedIndexBuffer			= false;

	basicConfig.useTexture					= true;
	basicConfig.textureType					= TestConfig::TEXTURETYPE_TEXTURE;

	basicConfig.sharedProgram				= false;

	basicConfig.textureWidth				= 128;
	basicConfig.textureHeight				= 128;

	basicConfig.surfaceWidth				= 256;
	basicConfig.surfaceHeight				= 256;

	const int	threadCounts[]				= { 1, 2, 4 };
	const int	perThreadContextCounts[]	= { 1, 2, 4 };

	// Add no sharing tests
	{
		TestCaseGroup* sharedNoneGroup = new TestCaseGroup(m_eglTestCtx, "no_shared_context", "Tests without sharing contexts.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedNoneGroup);
	}

	// Add no resource sharing tests
	{
		TestCaseGroup* sharedNoneGroup = new TestCaseGroup(m_eglTestCtx, "no_shared_resource", "Tests without shared resources.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedNoneGroup);
	}

	// Add shared coord buffer tests
	{
		TestCaseGroup* sharedCoordBufferGroup = new TestCaseGroup(m_eglTestCtx, "shared_coord_buffer", "Shared coordinate bufffer");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedCoordBuffer		= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedCoordBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedCoordBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedCoordBufferGroup);
	}

	// Add shared index buffer tests
	{
		TestCaseGroup* sharedIndexBufferGroup = new TestCaseGroup(m_eglTestCtx, "shared_index_buffer", "Shared index bufffer");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedIndexBuffer		= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedIndexBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedIndexBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedIndexBufferGroup);
	}

	// Add shared texture tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_texture", "Shared texture tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Add shared program tests
	{
		TestCaseGroup* sharedProgramGroup = new TestCaseGroup(m_eglTestCtx, "shared_program", "Shared program tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedProgram			= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedProgramGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedProgramGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedProgramGroup);
	}

	// Add shared all tests
	{
		TestCaseGroup* sharedallGroup = new TestCaseGroup(m_eglTestCtx, "shared_all", "Share all possible resources.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedCoordBuffer		= true;
				config.sharedIndexBuffer		= true;
				config.sharedProgram			= true;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedallGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedallGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedallGroup);
	}

	// Add EGLImage tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "egl_image", "EGL image tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config = basicConfig;

				config.textureType				= TestConfig::TEXTURETYPE_IMAGE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Add shared EGLImage tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_egl_image", "Shared EGLImage tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;

				config.textureType				= TestConfig::TEXTURETYPE_SHARED_IMAGE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Shared EGLImage texture test
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_egl_image_texture", "Shared EGLImage texture tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_IMAGE_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

}